

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::with_issuer(verifier<jwt::default_clock> *this,string *iss)

{
  verifier<jwt::default_clock> *pvVar1;
  string local_80;
  claim local_60 [2];
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *iss_local;
  verifier<jwt::default_clock> *this_local;
  
  local_18 = iss;
  iss_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"iss",&local_39);
  std::__cxx11::string::string((string *)&local_80,(string *)local_18);
  claim::claim(local_60,&local_80);
  pvVar1 = with_claim(this,&local_38,local_60);
  claim::~claim(local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return pvVar1;
}

Assistant:

verifier& with_issuer(const std::string& iss) { return with_claim("iss", claim(iss)); }